

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printAssociativeContainer<QMap<QString,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QMap<QString,_QVariant> *c)

{
  long lVar1;
  _func_int **pp_Var2;
  QDebug *pQVar3;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar4;
  QVariant *variant;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  long in_FS_OFFSET;
  QDebug local_48;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,"(");
  pQVar4 = (c->d).d.ptr;
  if (pQVar4 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  while( true ) {
    p_Var6 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar4 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                   *)0x0) {
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var5 == p_Var6) break;
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,'(');
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)(p_Var5 + 1));
    variant = (QVariant *)QDebug::operator<<(pQVar3,", ");
    ::operator<<(&local_48,variant);
    QDebug::operator<<(&local_48,')');
    QDebug::~QDebug(&local_48);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    pQVar4 = (c->d).d.ptr;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var2 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}